

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O1

void __thiscall xatlas::internal::segment::ClusteredCharts::mergeCharts(ClusteredCharts *this)

{
  Array<xatlas::internal::segment::ClusteredCharts::Chart_*> *this_00;
  Array<float> *this_01;
  Array<float> *this_02;
  Array<unsigned_int> *this_03;
  int *piVar1;
  float fVar2;
  float fVar3;
  uint32_t uVar4;
  uint8_t *puVar5;
  Chart *owner;
  Chart *chart;
  uint *puVar6;
  bool bVar7;
  bool bVar8;
  uint uVar9;
  uint32_t uVar10;
  int iVar11;
  char *pcVar12;
  bool bVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  uint index;
  float fVar18;
  float fVar19;
  FaceEdgeIterator it;
  uint32_t newBufferSize;
  float local_98;
  FaceEdgeIterator local_70;
  uint32_t local_54;
  ulong local_50;
  ulong local_48;
  long local_40;
  ulong local_38;
  
  this_00 = &this->m_charts;
  uVar10 = (this->m_charts).m_base.size;
  uVar9 = uVar10 - 1;
  uVar15 = (ulong)uVar9;
  if ((int)uVar9 < 0) {
LAB_0011f55d:
    uVar9 = (this->m_charts).m_base.size;
    if (0 < (int)uVar9) {
      index = 0;
      do {
        if (uVar9 <= index) goto LAB_0011f543;
        puVar5 = (this_00->m_base).buffer;
        if (puVar5 == (uint8_t *)0x0) goto LAB_0011f64f;
        puVar6 = *(uint **)(puVar5 + (ulong)index * 8);
        if (puVar6 == (uint *)0x0) {
          ArrayBase::removeAt(&this_00->m_base,index);
          uVar10 = (this->m_faceCharts).m_base.size;
          if (uVar10 != 0) {
            puVar5 = (this->m_faceCharts).m_base.buffer;
            lVar14 = 0;
            do {
              if ((this->m_faceCharts).m_base.size <= (uint)lVar14) goto LAB_0011f621;
              if (puVar5 == (uint8_t *)0x0) goto LAB_0011f638;
              uVar9 = *(uint *)(puVar5 + lVar14 * 4);
              if (uVar9 == index) {
                __assert_fail("m_faceCharts[i] != c",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                              ,0x15ec,
                              "void xatlas::internal::segment::ClusteredCharts::mergeCharts()");
              }
              if ((int)(this->m_charts).m_base.size < (int)uVar9) {
                __assert_fail("m_faceCharts[i] <= int32_t(m_charts.size())",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                              ,0x15ed,
                              "void xatlas::internal::segment::ClusteredCharts::mergeCharts()");
              }
              if ((int)index < (int)uVar9) {
                *(uint *)(puVar5 + lVar14 * 4) = uVar9 - 1;
              }
              lVar14 = lVar14 + 1;
            } while (uVar10 != (uint32_t)lVar14);
          }
        }
        else {
          *puVar6 = index;
          index = index + 1;
        }
        uVar9 = (this->m_charts).m_base.size;
      } while ((int)index < (int)uVar9);
    }
    return;
  }
  local_50 = uVar15;
  if (uVar9 < (this->m_charts).m_base.size) {
    this_01 = &this->m_sharedBoundaryLengths;
    this_02 = &this->m_sharedBoundaryLengthsNoSeams;
    this_03 = &this->m_sharedBoundaryEdgeCountNoSeams;
    local_40 = uVar15 + 1;
    bVar13 = false;
    local_54 = uVar10;
    do {
      puVar5 = (this_00->m_base).buffer;
      if (puVar5 == (uint8_t *)0x0) goto LAB_0011f64f;
      owner = *(Chart **)(puVar5 + uVar15 * 8);
      local_48 = uVar15;
      if (owner == (Chart *)0x0) {
        iVar11 = 6;
      }
      else {
        (this->m_sharedBoundaryLengths).m_base.size = uVar10;
        if ((this->m_sharedBoundaryLengths).m_base.capacity < uVar10) {
          ArrayBase::setArrayCapacity(&this_01->m_base,uVar10);
        }
        puVar5 = (this_01->m_base).buffer;
        if ((puVar5 != (uint8_t *)0x0) &&
           (uVar4 = (this->m_sharedBoundaryLengths).m_base.size, uVar4 != 0)) {
          memset(puVar5,0,(ulong)(uVar4 * (this->m_sharedBoundaryLengths).m_base.elementSize));
        }
        (this->m_sharedBoundaryLengthsNoSeams).m_base.size = uVar10;
        if ((this->m_sharedBoundaryLengthsNoSeams).m_base.capacity < uVar10) {
          ArrayBase::setArrayCapacity(&this_02->m_base,uVar10);
        }
        puVar5 = (this_02->m_base).buffer;
        if ((puVar5 != (uint8_t *)0x0) &&
           (uVar4 = (this->m_sharedBoundaryLengthsNoSeams).m_base.size, uVar4 != 0)) {
          memset(puVar5,0,(ulong)(uVar4 * (this->m_sharedBoundaryLengthsNoSeams).m_base.elementSize)
                );
        }
        (this->m_sharedBoundaryEdgeCountNoSeams).m_base.size = uVar10;
        if ((this->m_sharedBoundaryEdgeCountNoSeams).m_base.capacity < uVar10) {
          ArrayBase::setArrayCapacity(&this_03->m_base,uVar10);
        }
        puVar5 = (this_03->m_base).buffer;
        if ((puVar5 != (uint8_t *)0x0) &&
           (uVar10 = (this->m_sharedBoundaryEdgeCountNoSeams).m_base.size, uVar10 != 0)) {
          memset(puVar5,0,(ulong)(uVar10 * (this->m_sharedBoundaryEdgeCountNoSeams).m_base.
                                           elementSize));
        }
        local_38 = (ulong)(owner->faces).m_base.size;
        if (local_38 == 0) {
          local_98 = 0.0;
        }
        else {
          local_98 = 0.0;
          uVar15 = 0;
          do {
            if ((owner->faces).m_base.size <= uVar15) goto LAB_0011f685;
            puVar5 = (owner->faces).m_base.buffer;
            if (puVar5 == (uint8_t *)0x0) goto LAB_0011f666;
            local_70.m_face = *(uint32_t *)(puVar5 + uVar15 * 4);
            local_70.m_mesh = this->m_data->mesh;
            local_70.m_relativeEdge = 0;
            local_70.m_edge = local_70.m_face * 3;
            do {
              if ((this->m_data->edgeLengths).m_base.size <= local_70.m_edge) goto LAB_0011f5f0;
              puVar5 = (this->m_data->edgeLengths).m_base.buffer;
              if (puVar5 == (uint8_t *)0x0) goto LAB_0011f60a;
              fVar2 = *(float *)(puVar5 + (ulong)local_70.m_edge * 4);
              bVar7 = Mesh::FaceEdgeIterator::isBoundary(&local_70);
              if (bVar7) {
LAB_0011f1d4:
                local_98 = local_98 + fVar2;
              }
              else {
                uVar10 = Mesh::FaceEdgeIterator::oppositeFace(&local_70);
                if ((this->m_faceCharts).m_base.size <= uVar10) goto LAB_0011f621;
                puVar5 = (this->m_faceCharts).m_base.buffer;
                if (puVar5 == (uint8_t *)0x0) goto LAB_0011f638;
                uVar9 = *(uint *)(puVar5 + (ulong)uVar10 * 4);
                uVar17 = (ulong)uVar9;
                if (uVar17 == 0xffffffff) goto LAB_0011f1d4;
                if ((this->m_charts).m_base.size <= uVar9) goto LAB_0011f543;
                puVar5 = (this_00->m_base).buffer;
                if (puVar5 == (uint8_t *)0x0) goto LAB_0011f64f;
                if (*(Chart **)(puVar5 + uVar17 * 8) != owner) {
                  bVar7 = Mesh::isSeam(local_70.m_mesh,local_70.m_edge);
                  if ((bVar7) &&
                     ((bVar7 = isNormalSeam(this,local_70.m_edge), bVar7 ||
                      (bVar7 = Mesh::isTextureSeam(local_70.m_mesh,local_70.m_edge), bVar7)))) {
                    local_98 = local_98 + fVar2;
                  }
                  else {
                    if ((this->m_sharedBoundaryLengths).m_base.size <= uVar9) goto LAB_0011f5f0;
                    puVar5 = (this_01->m_base).buffer;
                    if (puVar5 == (uint8_t *)0x0) goto LAB_0011f60a;
                    *(float *)(puVar5 + uVar17 * 4) = *(float *)(puVar5 + uVar17 * 4) + fVar2;
                  }
                  if ((this->m_sharedBoundaryLengthsNoSeams).m_base.size <= uVar9)
                  goto LAB_0011f5f0;
                  puVar5 = (this_02->m_base).buffer;
                  if (puVar5 == (uint8_t *)0x0) goto LAB_0011f60a;
                  *(float *)(puVar5 + uVar17 * 4) = fVar2 + *(float *)(puVar5 + uVar17 * 4);
                  if ((this->m_sharedBoundaryEdgeCountNoSeams).m_base.size <= uVar9)
                  goto LAB_0011f685;
                  puVar5 = (this_03->m_base).buffer;
                  if (puVar5 == (uint8_t *)0x0) goto LAB_0011f666;
                  piVar1 = (int *)(puVar5 + uVar17 * 4);
                  *piVar1 = *piVar1 + 1;
                }
              }
              if (local_70.m_relativeEdge < 3) {
                local_70.m_edge = local_70.m_edge + 1;
                local_70.m_relativeEdge = local_70.m_relativeEdge + 1;
              }
            } while (local_70.m_relativeEdge != 3);
            uVar15 = uVar15 + 1;
          } while (uVar15 != local_38);
        }
        uVar15 = local_48;
        lVar14 = local_40;
        do {
          if (lVar14 - uVar15 != 1) {
            uVar17 = lVar14 - 1;
            if ((this->m_charts).m_base.size <= uVar17) goto LAB_0011f543;
            puVar5 = (this_00->m_base).buffer;
            if (puVar5 == (uint8_t *)0x0) goto LAB_0011f64f;
            chart = *(Chart **)(puVar5 + lVar14 * 8 + -8);
            bVar7 = true;
            if (chart != (Chart *)0x0) {
              if ((this->m_sharedBoundaryLengths).m_base.size <= uVar17) goto LAB_0011f5f0;
              puVar5 = (this_01->m_base).buffer;
              if (puVar5 == (uint8_t *)0x0) goto LAB_0011f60a;
              fVar2 = *(float *)(puVar5 + lVar14 * 4 + -4);
              if ((0.0 < fVar2) &&
                 (0.5 <= (chart->basis).normal.z * (owner->basis).normal.z +
                         (chart->basis).normal.x * (owner->basis).normal.x +
                         (chart->basis).normal.y * (owner->basis).normal.y)) {
                fVar3 = (this->m_data->options).maxChartArea;
                if ((fVar3 <= 0.0) || (owner->area + chart->area <= fVar3)) {
                  fVar3 = (this->m_data->options).maxBoundaryLength;
                  if (0.0 < fVar3) {
                    if ((this->m_sharedBoundaryLengthsNoSeams).m_base.size <= uVar17)
                    goto LAB_0011f5f0;
                    puVar5 = (this_02->m_base).buffer;
                    if (puVar5 == (uint8_t *)0x0) goto LAB_0011f60a;
                    if (fVar3 < (owner->boundaryLength + chart->boundaryLength) -
                                *(float *)(puVar5 + lVar14 * 4 + -4)) goto LAB_0011f4e6;
                  }
                  if ((this->m_sharedBoundaryLengthsNoSeams).m_base.size <= uVar17)
                  goto LAB_0011f5f0;
                  puVar5 = (this_02->m_base).buffer;
                  if (puVar5 == (uint8_t *)0x0) goto LAB_0011f60a;
                  fVar3 = *(float *)(puVar5 + lVar14 * 4 + -4);
                  if ((((fVar3 <= 0.0) || ((owner->faces).m_base.size < 2)) ||
                      ((chart->faces).m_base.size != 1)) || (owner->area * 0.1 < chart->area)) {
                    if ((chart->faces).m_base.size == 2) {
                      if ((this->m_sharedBoundaryEdgeCountNoSeams).m_base.size <= uVar17)
                      goto LAB_0011f685;
                      puVar5 = (this_03->m_base).buffer;
                      if (puVar5 == (uint8_t *)0x0) goto LAB_0011f666;
                      if (1 < *(uint *)(puVar5 + lVar14 * 4 + -4)) goto LAB_0011f4bf;
                    }
                    if (0.0 < fVar3) {
                      fVar18 = ABS(chart->boundaryLength);
                      fVar19 = fVar3;
                      if (fVar3 <= fVar18) {
                        fVar19 = fVar18;
                      }
                      fVar18 = 1.0;
                      if (1.0 <= fVar19) {
                        fVar18 = fVar19;
                      }
                      if (ABS(fVar3 - chart->boundaryLength) <= fVar18 * 0.0001) goto LAB_0011f4bf;
                    }
                    fVar18 = owner->boundaryLength - local_98;
                    fVar19 = 0.0;
                    if (0.0 <= fVar18) {
                      fVar19 = fVar18;
                    }
                    if ((fVar2 <= fVar19 * 0.2) && (fVar2 <= chart->boundaryLength * 0.75))
                    goto LAB_0011f4e6;
                  }
LAB_0011f4bf:
                  bVar8 = mergeChart(this,owner,chart,fVar3);
                  bVar7 = !bVar8;
                  if (bVar8) {
                    bVar13 = true;
                  }
                }
              }
            }
LAB_0011f4e6:
            if (!bVar7) break;
          }
          lVar16 = lVar14 + -1;
          bVar7 = 0 < lVar14;
          lVar14 = lVar16;
        } while (lVar16 != 0 && bVar7);
        iVar11 = (uint)bVar13 << 2;
        uVar10 = local_54;
      }
      if (((iVar11 == 6) || (iVar11 == 0)) && (0 < (long)local_48)) {
        uVar15 = local_48 - 1;
      }
      else {
        if (((int)local_50 < 0) || (!bVar13)) goto LAB_0011f55d;
        bVar13 = false;
        uVar15 = local_50;
      }
    } while (uVar15 < (this->m_charts).m_base.size);
  }
LAB_0011f543:
  pcVar12 = 
  "T &xatlas::internal::Array<xatlas::internal::segment::ClusteredCharts::Chart *>::operator[](uint32_t) [T = xatlas::internal::segment::ClusteredCharts::Chart *]"
  ;
LAB_0011f69a:
  __assert_fail("index < m_base.size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                ,0x47f,pcVar12);
LAB_0011f5f0:
  pcVar12 = "T &xatlas::internal::Array<float>::operator[](uint32_t) [T = float]";
  goto LAB_0011f69a;
LAB_0011f60a:
  pcVar12 = "T &xatlas::internal::Array<float>::operator[](uint32_t) [T = float]";
  goto LAB_0011f67b;
LAB_0011f685:
  pcVar12 = "T &xatlas::internal::Array<unsigned int>::operator[](uint32_t) [T = unsigned int]";
  goto LAB_0011f69a;
LAB_0011f666:
  pcVar12 = "T &xatlas::internal::Array<unsigned int>::operator[](uint32_t) [T = unsigned int]";
  goto LAB_0011f67b;
LAB_0011f64f:
  pcVar12 = 
  "T &xatlas::internal::Array<xatlas::internal::segment::ClusteredCharts::Chart *>::operator[](uint32_t) [T = xatlas::internal::segment::ClusteredCharts::Chart *]"
  ;
  goto LAB_0011f67b;
LAB_0011f621:
  pcVar12 = "T &xatlas::internal::Array<int>::operator[](uint32_t) [T = int]";
  goto LAB_0011f69a;
LAB_0011f638:
  pcVar12 = "T &xatlas::internal::Array<int>::operator[](uint32_t) [T = int]";
LAB_0011f67b:
  __assert_fail("m_base.buffer",
                "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                ,0x480,pcVar12);
}

Assistant:

void mergeCharts()
	{
		XA_PROFILE_START(clusteredChartsMerge)
		const uint32_t chartCount = m_charts.size();
		// Merge charts progressively until there's none left to merge.
		for (;;) {
			bool merged = false;
			for (int c = chartCount - 1; c >= 0; c--) {
				Chart *chart = m_charts[c];
				if (chart == nullptr)
					continue;
				float externalBoundaryLength = 0.0f;
				m_sharedBoundaryLengths.resize(chartCount);
				m_sharedBoundaryLengths.zeroOutMemory();
				m_sharedBoundaryLengthsNoSeams.resize(chartCount);
				m_sharedBoundaryLengthsNoSeams.zeroOutMemory();
				m_sharedBoundaryEdgeCountNoSeams.resize(chartCount);
				m_sharedBoundaryEdgeCountNoSeams.zeroOutMemory();
				const uint32_t faceCount = chart->faces.size();
				for (uint32_t i = 0; i < faceCount; i++) {
					const uint32_t f = chart->faces[i];
					for (Mesh::FaceEdgeIterator it(m_data.mesh, f); !it.isDone(); it.advance()) {
						const float l = m_data.edgeLengths[it.edge()];
						if (it.isBoundary()) {
							externalBoundaryLength += l;
						} else {
							const int neighborChart = m_faceCharts[it.oppositeFace()];
							if (neighborChart == -1)
								externalBoundaryLength += l;
							else if (m_charts[neighborChart] != chart) {
								if ((it.isSeam() && (isNormalSeam(it.edge()) || it.isTextureSeam()))) {
									externalBoundaryLength += l;
								} else {
									m_sharedBoundaryLengths[neighborChart] += l;
								}
								m_sharedBoundaryLengthsNoSeams[neighborChart] += l;
								m_sharedBoundaryEdgeCountNoSeams[neighborChart]++;
							}
						}
					}
				}
				for (int cc = chartCount - 1; cc >= 0; cc--) {
					if (cc == c)
						continue;
					Chart *chart2 = m_charts[cc];
					if (chart2 == nullptr)
						continue;
					// Must share a boundary.
					if (m_sharedBoundaryLengths[cc] <= 0.0f)
						continue;
					// Compare proxies.
					if (dot(chart2->basis.normal, chart->basis.normal) < XA_MERGE_CHARTS_MIN_NORMAL_DEVIATION)
						continue;
					// Obey max chart area and boundary length.
					if (m_data.options.maxChartArea > 0.0f && chart->area + chart2->area > m_data.options.maxChartArea)
						continue;
					if (m_data.options.maxBoundaryLength > 0.0f && chart->boundaryLength + chart2->boundaryLength - m_sharedBoundaryLengthsNoSeams[cc] > m_data.options.maxBoundaryLength)
						continue;
					// Merge if chart2 has a single face.
					// chart1 must have more than 1 face.
					// chart2 area must be <= 10% of chart1 area.
					if (m_sharedBoundaryLengthsNoSeams[cc] > 0.0f && chart->faces.size() > 1 && chart2->faces.size() == 1 && chart2->area <= chart->area * 0.1f)
						goto merge;
					// Merge if chart2 has two faces (probably a quad), and chart1 bounds at least 2 of its edges.
					if (chart2->faces.size() == 2 && m_sharedBoundaryEdgeCountNoSeams[cc] >= 2)
						goto merge;
					// Merge if chart2 is wholely inside chart1, ignoring seams.
					if (m_sharedBoundaryLengthsNoSeams[cc] > 0.0f && equal(m_sharedBoundaryLengthsNoSeams[cc], chart2->boundaryLength, kEpsilon))
						goto merge;
					if (m_sharedBoundaryLengths[cc] > 0.2f * max(0.0f, chart->boundaryLength - externalBoundaryLength) ||
						m_sharedBoundaryLengths[cc] > 0.75f * chart2->boundaryLength)
						goto merge;
					continue;
				merge:
					if (!mergeChart(chart, chart2, m_sharedBoundaryLengthsNoSeams[cc]))
						continue;
					merged = true;
					break;
				}
				if (merged)
					break;
			}
			if (!merged)
				break;
		}
		// Remove deleted charts.
		for (int c = 0; c < int32_t(m_charts.size()); /*do not increment if removed*/) {
			if (m_charts[c] == nullptr) {
				m_charts.removeAt(c);
				// Update m_faceCharts.
				const uint32_t faceCount = m_faceCharts.size();
				for (uint32_t i = 0; i < faceCount; i++) {
					XA_DEBUG_ASSERT(m_faceCharts[i] != c);
					XA_DEBUG_ASSERT(m_faceCharts[i] <= int32_t(m_charts.size()));
					if (m_faceCharts[i] > c) {
						m_faceCharts[i]--;
					}
				}
			} else {
				m_charts[c]->id = c;
				c++;
			}
		}
		XA_PROFILE_END(clusteredChartsMerge)
	}